

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

bool __thiscall FIX::SessionState::needHeartbeat(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  
  iVar1 = (now->super_DateTime).m_date;
  iVar2 = (this->m_lastSentTime).super_DateTime.m_date;
  auVar3 = SEXT816(0x112e0be826d694b3) * SEXT816((now->super_DateTime).m_time);
  auVar4 = SEXT816(-0x112e0be826d694b3) * SEXT816((this->m_lastSentTime).super_DateTime.m_time);
  iVar5 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  return this->m_testRequest == 0 &&
         iVar5 <= ((int)(auVar4._8_8_ >> 0x1a) - (auVar4._12_4_ >> 0x1f)) +
                  ((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) +
                  (iVar1 - iVar2) * 0x15180;
}

Assistant:

bool needHeartbeat(const UtcTimeStamp &now) const {
    return ((now - lastSentTime()) >= heartBtInt()) && !testRequest();
  }